

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264.c
# Opt level: O3

int h264_ref_pic_list_modification
              (bitstream *str,h264_slice *slice,h264_ref_pic_list_modification *list)

{
  uint32_t *puVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  h264_slice_ref_pic_list_modification_entry *val;
  
  iVar3 = 1;
  iVar2 = vs_u(str,&list->flag,1);
  if (iVar2 == 0) {
    val = list->list;
    if (list->flag == 0) {
      iVar2 = vs_infer(str,&val->op,3);
      if (iVar2 != 0) {
        return 1;
      }
    }
    else {
      lVar4 = 0x21;
      do {
        iVar2 = vs_ue(str,&val->op);
        if (iVar2 != 0) {
          return 1;
        }
        if (val->op == 3) break;
        iVar2 = vs_ue(str,&val->param);
        if (iVar2 != 0) {
          return 1;
        }
        lVar4 = lVar4 + -1;
        if (lVar4 == 0) {
          h264_ref_pic_list_modification_cold_1();
          return 1;
        }
        puVar1 = &val->op;
        val = val + 1;
      } while (*puVar1 != 3);
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int h264_ref_pic_list_modification(struct bitstream *str, struct h264_slice *slice, struct h264_ref_pic_list_modification *list) {
	int i;
	if (vs_u(str, &list->flag, 1)) return 1;
	if (list->flag) {
		i = 0;
		do {
			if (vs_ue(str, &list->list[i].op)) return 1;
			if (list->list[i].op != 3) {
				if (vs_ue(str, &list->list[i].param)) return 1;
				if (i == 32) {
					fprintf(stderr, "Too many ref_pic_list_modification entries\n");
					return 1;
				}
			}
		} while (list->list[i++].op != 3);
	} else {
		if (vs_infer(str, &list->list[0].op, 3)) return 1;
	}
	return 0;
}